

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasLazyFields
               (Descriptor *descriptor,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  MessageSCCAnalyzer *extraout_RDX;
  MessageSCCAnalyzer *extraout_RDX_00;
  MessageSCCAnalyzer *extraout_RDX_01;
  MessageSCCAnalyzer *pMVar2;
  MessageSCCAnalyzer *extraout_RDX_02;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  bVar3 = 0 < *(int *)(descriptor + 4);
  pMVar2 = scc_analyzer;
  if (0 < *(int *)(descriptor + 4)) {
    bVar1 = IsLazy(*(FieldDescriptor **)(descriptor + 0x28),options,scc_analyzer);
    pMVar2 = extraout_RDX;
    if (!bVar1) {
      lVar5 = 0;
      lVar4 = 0x48;
      do {
        lVar5 = lVar5 + 1;
        bVar3 = lVar5 < *(int *)(descriptor + 4);
        if (*(int *)(descriptor + 4) <= lVar5) goto LAB_00240cde;
        bVar1 = IsLazy((FieldDescriptor *)(lVar4 + *(long *)(descriptor + 0x28)),options,pMVar2);
        pMVar2 = extraout_RDX_00;
        lVar4 = lVar4 + 0x48;
      } while (!bVar1);
    }
    if (bVar3) {
      return true;
    }
  }
LAB_00240cde:
  bVar3 = 0 < *(int *)(descriptor + 0x7c);
  if (0 < *(int *)(descriptor + 0x7c)) {
    bVar1 = IsLazy(*(FieldDescriptor **)(descriptor + 0x50),options,pMVar2);
    if (!bVar1) {
      lVar5 = 0;
      pMVar2 = extraout_RDX_01;
      lVar4 = 0x48;
      do {
        lVar5 = lVar5 + 1;
        bVar3 = lVar5 < *(int *)(descriptor + 0x7c);
        if (*(int *)(descriptor + 0x7c) <= lVar5) goto LAB_00240d30;
        bVar1 = IsLazy((FieldDescriptor *)(lVar4 + *(long *)(descriptor + 0x50)),options,pMVar2);
        pMVar2 = extraout_RDX_02;
        lVar4 = lVar4 + 0x48;
      } while (!bVar1);
    }
    if (bVar3) {
      return true;
    }
  }
LAB_00240d30:
  bVar3 = 0 < *(int *)(descriptor + 0x70);
  if ((0 < *(int *)(descriptor + 0x70)) &&
     (bVar1 = HasLazyFields(*(Descriptor **)(descriptor + 0x38),options,scc_analyzer), !bVar1)) {
    lVar5 = 0;
    lVar4 = 0x88;
    do {
      lVar5 = lVar5 + 1;
      bVar3 = lVar5 < *(int *)(descriptor + 0x70);
      if (*(int *)(descriptor + 0x70) <= lVar5) {
        return bVar3;
      }
      bVar1 = HasLazyFields((Descriptor *)(lVar4 + *(long *)(descriptor + 0x38)),options,
                            scc_analyzer);
      lVar4 = lVar4 + 0x88;
    } while (!bVar1);
  }
  return bVar3;
}

Assistant:

static bool HasLazyFields(const Descriptor* descriptor, const Options& options,
                          MessageSCCAnalyzer* scc_analyzer) {
  for (int field_idx = 0; field_idx < descriptor->field_count(); field_idx++) {
    if (IsLazy(descriptor->field(field_idx), options, scc_analyzer)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->extension_count(); idx++) {
    if (IsLazy(descriptor->extension(idx), options, scc_analyzer)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->nested_type_count(); idx++) {
    if (HasLazyFields(descriptor->nested_type(idx), options, scc_analyzer)) {
      return true;
    }
  }
  return false;
}